

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acm.cpp
# Opt level: O0

void __thiscall intel_acm_t::_read(intel_acm_t *this)

{
  kstream *this_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  header_t *phVar4;
  string local_48;
  unique_ptr<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_> local_18;
  intel_acm_t *local_10;
  intel_acm_t *this_local;
  
  local_10 = this;
  phVar4 = (header_t *)operator_new(0xf0);
  header_t::header_t(phVar4,(this->super_kstruct).m__io,this,this->m__root);
  std::unique_ptr<intel_acm_t::header_t,std::default_delete<intel_acm_t::header_t>>::
  unique_ptr<std::default_delete<intel_acm_t::header_t>,void>
            ((unique_ptr<intel_acm_t::header_t,std::default_delete<intel_acm_t::header_t>> *)
             &local_18,phVar4);
  std::unique_ptr<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>::operator=
            (&this->m_header,&local_18);
  std::unique_ptr<intel_acm_t::header_t,_std::default_delete<intel_acm_t::header_t>_>::~unique_ptr
            (&local_18);
  this_00 = (this->super_kstruct).m__io;
  phVar4 = header(this);
  uVar1 = header_t::module_size(phVar4);
  phVar4 = header(this);
  uVar2 = header_t::header_size(phVar4);
  phVar4 = header(this);
  uVar3 = header_t::scratch_space_size(phVar4);
  kaitai::kstream::read_bytes_abi_cxx11_(&local_48,this_00,(ulong)(((uVar1 - uVar2) - uVar3) * 4));
  std::__cxx11::string::operator=((string *)&this->m_body,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void intel_acm_t::_read() {
    m_header = std::unique_ptr<header_t>(new header_t(m__io, this, m__root));
    m_body = m__io->read_bytes((4 * ((header()->module_size() - header()->header_size()) - header()->scratch_space_size())));
}